

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

int read_palette(store_palette_entry *palette,int *npalette,png_const_structp pp,png_infop pi)

{
  int iVar1;
  uint uVar2;
  int local_50;
  int local_4c;
  int i_2;
  int i_1;
  int i;
  int num;
  png_bytep trans_alpha;
  png_colorp pal;
  png_infop pi_local;
  png_const_structp pp_local;
  int *npalette_local;
  store_palette_entry *palette_local;
  
  trans_alpha = (png_bytep)0x0;
  *npalette = -1;
  pal = (png_colorp)pi;
  pi_local = (png_infop)pp;
  pp_local = (png_const_structp)npalette;
  npalette_local = (int *)palette;
  uVar2 = png_get_PLTE(pp,pi,&trans_alpha,npalette);
  if ((uVar2 & 8) == 0) {
    if (*(int *)pp_local != -1) {
      png_error(pi_local,"validate: invalid PLTE result");
    }
    *(undefined4 *)pp_local = 0;
    memset(npalette_local,0x71,0x400);
  }
  else {
    i_2 = *(int *)pp_local;
    if ((i_2 < 1) || (0x100 < i_2)) {
      png_error(pi_local,"validate: invalid PLTE count");
    }
    while (i_2 = i_2 + -1, -1 < i_2) {
      *(png_byte *)(npalette_local + i_2) = trans_alpha[(long)i_2 * 3];
      *(png_byte *)((long)npalette_local + (long)i_2 * 4 + 1) = trans_alpha[(long)i_2 * 3 + 1];
      *(png_byte *)((long)npalette_local + (long)i_2 * 4 + 2) = trans_alpha[(long)i_2 * 3 + 2];
    }
    memset(npalette_local + *(int *)pp_local,0x7e,(long)(0x100 - *(int *)pp_local) << 2);
  }
  _i = 0;
  i_1 = 2;
  uVar2 = png_get_tRNS(pi_local,pal,&i,&i_1,0);
  if ((((uVar2 & 0x10) == 0) || ((_i == 0 && (i_1 == 1)))) || ((_i != 0 && (i_1 == 0)))) {
    local_50 = 0;
    iVar1 = *(int *)pp_local;
    for (; local_50 < iVar1; local_50 = local_50 + 1) {
      *(undefined1 *)((long)npalette_local + (long)local_50 * 4 + 3) = 0xff;
    }
    for (; local_50 < 0x100; local_50 = local_50 + 1) {
      *(undefined1 *)((long)npalette_local + (long)local_50 * 4 + 3) = 0x37;
    }
    palette_local._4_4_ = 0;
  }
  else {
    if ((((_i == 0) || (i_1 < 1)) || (0x100 < i_1)) || (*(int *)pp_local < i_1)) {
      png_error(pi_local,"validate: unexpected png_get_tRNS (palette) result");
    }
    for (local_4c = 0; local_4c < i_1; local_4c = local_4c + 1) {
      *(undefined1 *)((long)npalette_local + (long)local_4c * 4 + 3) =
           *(undefined1 *)(_i + local_4c);
    }
    iVar1 = *(int *)pp_local;
    for (; local_4c < iVar1; local_4c = local_4c + 1) {
      *(undefined1 *)((long)npalette_local + (long)local_4c * 4 + 3) = 0xff;
    }
    for (; local_4c < 0x100; local_4c = local_4c + 1) {
      *(undefined1 *)((long)npalette_local + (long)local_4c * 4 + 3) = 0x21;
    }
    palette_local._4_4_ = 1;
  }
  return palette_local._4_4_;
}

Assistant:

static int
read_palette(store_palette palette, int *npalette, png_const_structp pp,
   png_infop pi)
{
   png_colorp pal;
   png_bytep trans_alpha;
   int num;

   pal = 0;
   *npalette = -1;

   if (png_get_PLTE(pp, pi, &pal, npalette) & PNG_INFO_PLTE)
   {
      int i = *npalette;

      if (i <= 0 || i > 256)
         png_error(pp, "validate: invalid PLTE count");

      while (--i >= 0)
      {
         palette[i].red = pal[i].red;
         palette[i].green = pal[i].green;
         palette[i].blue = pal[i].blue;
      }

      /* Mark the remainder of the entries with a flag value (other than
       * white/opaque which is the flag value stored above.)
       */
      memset(palette + *npalette, 126, (256-*npalette) * sizeof *palette);
   }

   else /* !png_get_PLTE */
   {
      if (*npalette != (-1))
         png_error(pp, "validate: invalid PLTE result");
      /* But there is no palette, so record this: */
      *npalette = 0;
      memset(palette, 113, sizeof (store_palette));
   }

   trans_alpha = 0;
   num = 2; /* force error below */
   if ((png_get_tRNS(pp, pi, &trans_alpha, &num, 0) & PNG_INFO_tRNS) != 0 &&
      (trans_alpha != NULL || num != 1/*returns 1 for a transparent color*/) &&
      /* Oops, if a palette tRNS gets expanded png_read_update_info (at least so
       * far as 1.5.4) does not remove the trans_alpha pointer, only num_trans,
       * so in the above call we get a success, we get a pointer (who knows what
       * to) and we get num_trans == 0:
       */
      !(trans_alpha != NULL && num == 0)) /* TODO: fix this in libpng. */
   {
      int i;

      /* Any of these are crash-worthy - given the implementation of
       * png_get_tRNS up to 1.5 an app won't crash if it just checks the
       * result above and fails to check that the variables it passed have
       * actually been filled in!  Note that if the app were to pass the
       * last, png_color_16p, variable too it couldn't rely on this.
       */
      if (trans_alpha == NULL || num <= 0 || num > 256 || num > *npalette)
         png_error(pp, "validate: unexpected png_get_tRNS (palette) result");

      for (i=0; i<num; ++i)
         palette[i].alpha = trans_alpha[i];

      for (num=*npalette; i<num; ++i)
         palette[i].alpha = 255;

      for (; i<256; ++i)
         palette[i].alpha = 33; /* flag value */

      return 1; /* transparency */
   }

   else
   {
      /* No palette transparency - just set the alpha channel to opaque. */
      int i;

      for (i=0, num=*npalette; i<num; ++i)
         palette[i].alpha = 255;

      for (; i<256; ++i)
         palette[i].alpha = 55; /* flag value */

      return 0; /* no transparency */
   }
}